

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlcachedresult.cpp
# Opt level: O0

bool __thiscall QSqlCachedResult::fetchFirst(QSqlCachedResult *this)

{
  bool bVar1;
  int iVar2;
  QSqlCachedResultPrivate *this_00;
  QSqlResult *in_RDI;
  QSqlCachedResultPrivate *d;
  bool local_1;
  
  this_00 = d_func((QSqlCachedResult *)0x1198ac);
  if ((((byte)this_00[0xaa] & 1) != 0) && (iVar2 = QSqlResult::at(in_RDI), iVar2 != -1)) {
    return false;
  }
  bVar1 = QSqlCachedResultPrivate::canSeek(this_00,0);
  if (bVar1) {
    (*in_RDI->_vptr_QSqlResult[3])(in_RDI,0);
    local_1 = true;
  }
  else {
    local_1 = cacheNext((QSqlCachedResult *)this_00);
  }
  return local_1;
}

Assistant:

bool QSqlCachedResult::fetchFirst()
{
    Q_D(QSqlCachedResult);
    if (d->forwardOnly && at() != QSql::BeforeFirstRow) {
        return false;
    }
    if (d->canSeek(0)) {
        setAt(0);
        return true;
    }
    return cacheNext();
}